

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[21],kj::StringPtr&,char_const(&)[16],kj::String>
          (String *__return_storage_ptr__,kj *this,char (*params) [21],StringPtr *params_1,
          char (*params_2) [16],String *params_3)

{
  char (*value) [21];
  StringPtr *value_00;
  char (*value_01) [16];
  String *value_02;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  NoInfer<kj::String> *local_30;
  String *params_local_3;
  char (*params_local_2) [16];
  StringPtr *params_local_1;
  char (*params_local) [21];
  
  local_30 = (NoInfer<kj::String> *)params_2;
  params_local_3 = (String *)params_1;
  params_local_2 = (char (*) [16])params;
  params_local_1 = (StringPtr *)this;
  params_local = (char (*) [21])__return_storage_ptr__;
  value = ::const((char (*) [21])this);
  local_40 = toCharSequence<char_const(&)[21]>(value);
  value_00 = fwd<kj::StringPtr&>((StringPtr *)params_local_2);
  local_50 = toCharSequence<kj::StringPtr&>(value_00);
  value_01 = ::const((char (*) [16])params_local_3);
  local_60 = toCharSequence<char_const(&)[16]>(value_01);
  value_02 = fwd<kj::String>(local_30);
  local_70 = toCharSequence<kj::String>(value_02);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,&local_50,&local_60,&local_70,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}